

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O0

vector<docopt::OptionsShortcut_*,_std::allocator<docopt::OptionsShortcut_*>_> *
flat_filter<docopt::OptionsShortcut>
          (vector<docopt::OptionsShortcut_*,_std::allocator<docopt::OptionsShortcut_*>_>
           *__return_storage_ptr__,Pattern *pattern)

{
  _func_bool_Pattern_ptr *p_Var1;
  iterator iVar2;
  iterator iVar3;
  back_insert_iterator<std::vector<docopt::OptionsShortcut_*,_std::allocator<docopt::OptionsShortcut_*>_>_>
  bVar4;
  _lambda_docopt__Pattern_const___1_ local_31;
  undefined1 local_30 [8];
  vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_> flattened;
  Pattern *pattern_local;
  vector<docopt::OptionsShortcut_*,_std::allocator<docopt::OptionsShortcut_*>_> *ret;
  
  flattened.super__Vector_base<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pattern;
  p_Var1 = flat_filter(docopt::Pattern&)::{lambda(docopt::Pattern_const*)#1}::
           operator_cast_to_function_pointer(&local_31);
  (**pattern->_vptr_Pattern)
            ((vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_> *)local_30,pattern,
             p_Var1);
  std::vector<docopt::OptionsShortcut_*,_std::allocator<docopt::OptionsShortcut_*>_>::vector
            (__return_storage_ptr__);
  iVar2 = std::vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>::begin
                    ((vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_> *)local_30);
  iVar3 = std::vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>::end
                    ((vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_> *)local_30);
  bVar4 = std::
          back_inserter<std::vector<docopt::OptionsShortcut*,std::allocator<docopt::OptionsShortcut*>>>
                    (__return_storage_ptr__);
  std::
  transform<__gnu_cxx::__normal_iterator<docopt::Pattern**,std::vector<docopt::Pattern*,std::allocator<docopt::Pattern*>>>,std::back_insert_iterator<std::vector<docopt::OptionsShortcut*,std::allocator<docopt::OptionsShortcut*>>>,flat_filter<docopt::OptionsShortcut>(docopt::Pattern&)::_lambda(docopt::Pattern*)_1_>
            (iVar2._M_current,iVar3._M_current,bVar4.container);
  std::vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>::~vector
            ((vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T*> flat_filter(Pattern& pattern) {
	std::vector<Pattern*> flattened = pattern.flat([](Pattern const* p) -> bool {
		return dynamic_cast<T const*>(p) != nullptr;
	});

	// now, we're guaranteed to have T*'s, so just use static_cast
	std::vector<T*> ret;
	std::transform(flattened.begin(), flattened.end(), std::back_inserter(ret), [](Pattern* p) {
		return static_cast<T*>(p);
	});
	return ret;
}